

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_motion.c
# Opt level: O1

void av1_generate_block_2x2_hash_value
               (IntraBCHashInfo *intrabc_hash_info,YV12_BUFFER_CONFIG *picture,
               uint32_t **pic_block_hash,int8_t **pic_block_same_info)

{
  uint32_t **ppuVar1;
  uint uVar2;
  int iVar3;
  uint32_t uVar4;
  uint uVar5;
  long lVar6;
  uint8_t *puVar7;
  int iVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  ulong uVar14;
  bool bVar15;
  uint8_t p [4];
  uint16_t p_1 [4];
  uint8_t local_7c [4];
  short local_78 [4];
  ulong local_70;
  uint local_64;
  ulong local_60;
  ulong local_58;
  int8_t **local_50;
  uint32_t **local_48;
  CRC_CALCULATOR *local_40;
  CRC_CALCULATOR *local_38;
  
  uVar2 = (picture->field_2).field_0.y_crop_width;
  uVar9 = (ulong)uVar2;
  iVar3 = (picture->field_3).field_0.y_crop_height;
  uVar2 = uVar2 - 1;
  local_64 = iVar3 - 1;
  local_40 = &intrabc_hash_info->crc_calculator1;
  local_38 = &intrabc_hash_info->crc_calculator2;
  local_58 = uVar9;
  local_50 = pic_block_same_info;
  local_48 = pic_block_hash;
  if ((picture->flags & 8) == 0) {
    if (1 < iVar3) {
      local_70 = (ulong)uVar2;
      local_60 = 0;
      uVar14 = 0;
      uVar2 = local_64;
      do {
        if (1 < (int)uVar9) {
          uVar14 = (ulong)(int)uVar14;
          iVar3 = (int)local_60;
          uVar10 = 0;
          do {
            lVar6 = (long)(picture->field_4).field_0.y_stride;
            puVar7 = (picture->field_5).buffers[0] + uVar10 + lVar6 * iVar3;
            lVar11 = 0;
            iVar8 = 0;
            do {
              lVar11 = (long)(int)lVar11;
              lVar12 = 0;
              do {
                local_7c[lVar11] = puVar7[lVar12];
                lVar11 = lVar11 + 1;
                lVar12 = lVar12 + 1;
              } while (lVar12 == 1);
              puVar7 = puVar7 + lVar6;
              bVar15 = iVar8 == 0;
              iVar8 = iVar8 + 1;
            } while (bVar15);
            (*local_50)[uVar14] = local_7c[3] == local_7c[2] && local_7c[0] == local_7c[1];
            local_50[1][uVar14] = local_7c[3] == local_7c[1] && local_7c[0] == local_7c[2];
            uVar4 = av1_get_crc_value(local_40,local_7c,4);
            (*pic_block_hash)[uVar14] = uVar4;
            uVar4 = av1_get_crc_value(local_38,local_7c,4);
            pic_block_hash[1][uVar14] = uVar4;
            uVar14 = uVar14 + 1;
            uVar10 = uVar10 + 1;
            uVar9 = local_58;
            uVar2 = local_64;
          } while (uVar10 != local_70);
        }
        uVar14 = (ulong)((int)uVar14 + 1);
        uVar5 = (int)local_60 + 1;
        local_60 = (ulong)uVar5;
      } while (uVar5 != uVar2);
    }
  }
  else if (1 < iVar3) {
    local_60 = (ulong)uVar2;
    local_70 = 0;
    uVar14 = 0;
    uVar2 = local_64;
    do {
      if (1 < (int)uVar9) {
        uVar14 = (ulong)(int)uVar14;
        lVar6 = 0;
        uVar10 = 0;
        do {
          iVar3 = (picture->field_4).field_0.y_stride;
          lVar11 = (long)((int)local_70 * iVar3) * 2 + lVar6 +
                   (long)(picture->field_5).field_0.y_buffer * 2;
          lVar12 = 0;
          iVar8 = 0;
          do {
            lVar12 = (long)(int)lVar12;
            lVar13 = 0;
            do {
              local_78[lVar12] = *(short *)(lVar11 + lVar13 * 2);
              lVar12 = lVar12 + 1;
              lVar13 = lVar13 + 1;
            } while (lVar13 == 1);
            lVar11 = lVar11 + (long)iVar3 * 2;
            bVar15 = iVar8 == 0;
            iVar8 = iVar8 + 1;
          } while (bVar15);
          (*local_50)[uVar14] = local_78[3] == local_78[2] && local_78[0] == local_78[1];
          local_50[1][uVar14] = local_78[3] == local_78[1] && local_78[0] == local_78[2];
          uVar4 = av1_get_crc_value(local_40,(uint8_t *)local_78,8);
          ppuVar1 = local_48;
          (*local_48)[uVar14] = uVar4;
          uVar4 = av1_get_crc_value(local_38,(uint8_t *)local_78,8);
          ppuVar1[1][uVar14] = uVar4;
          uVar14 = uVar14 + 1;
          uVar10 = uVar10 + 1;
          lVar6 = lVar6 + 2;
          uVar9 = local_58;
          uVar2 = local_64;
        } while (uVar10 != local_60);
      }
      uVar14 = (ulong)((int)uVar14 + 1);
      uVar5 = (int)local_70 + 1;
      local_70 = (ulong)uVar5;
    } while (uVar5 != uVar2);
  }
  return;
}

Assistant:

void av1_generate_block_2x2_hash_value(IntraBCHashInfo *intrabc_hash_info,
                                       const YV12_BUFFER_CONFIG *picture,
                                       uint32_t *pic_block_hash[2],
                                       int8_t *pic_block_same_info[3]) {
  const int width = 2;
  const int height = 2;
  const int x_end = picture->y_crop_width - width + 1;
  const int y_end = picture->y_crop_height - height + 1;
  CRC_CALCULATOR *calc_1 = &intrabc_hash_info->crc_calculator1;
  CRC_CALCULATOR *calc_2 = &intrabc_hash_info->crc_calculator2;

  const int length = width * 2;
  if (picture->flags & YV12_FLAG_HIGHBITDEPTH) {
    uint16_t p[4];
    int pos = 0;
    for (int y_pos = 0; y_pos < y_end; y_pos++) {
      for (int x_pos = 0; x_pos < x_end; x_pos++) {
        get_pixels_in_1D_short_array_by_block_2x2(
            CONVERT_TO_SHORTPTR(picture->y_buffer) + y_pos * picture->y_stride +
                x_pos,
            picture->y_stride, p);
        pic_block_same_info[0][pos] = is_block16_2x2_row_same_value(p);
        pic_block_same_info[1][pos] = is_block16_2x2_col_same_value(p);

        pic_block_hash[0][pos] =
            av1_get_crc_value(calc_1, (uint8_t *)p, length * sizeof(p[0]));
        pic_block_hash[1][pos] =
            av1_get_crc_value(calc_2, (uint8_t *)p, length * sizeof(p[0]));
        pos++;
      }
      pos += width - 1;
    }
  } else {
    uint8_t p[4];
    int pos = 0;
    for (int y_pos = 0; y_pos < y_end; y_pos++) {
      for (int x_pos = 0; x_pos < x_end; x_pos++) {
        get_pixels_in_1D_char_array_by_block_2x2(
            picture->y_buffer + y_pos * picture->y_stride + x_pos,
            picture->y_stride, p);
        pic_block_same_info[0][pos] = is_block_2x2_row_same_value(p);
        pic_block_same_info[1][pos] = is_block_2x2_col_same_value(p);

        pic_block_hash[0][pos] =
            av1_get_crc_value(calc_1, p, length * sizeof(p[0]));
        pic_block_hash[1][pos] =
            av1_get_crc_value(calc_2, p, length * sizeof(p[0]));
        pos++;
      }
      pos += width - 1;
    }
  }
}